

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_of_responsibility1.cpp
# Opt level: O0

int main(void)

{
  HelpHandler *h;
  Widget *h_00;
  Button *this;
  Button *button;
  Dialog *dialog;
  Application *application;
  Topic APPLICATION_TOPIC;
  Topic PAPER_ORIENTATION_TOPIC;
  Topic PRINT_TOPIC;
  
  h = (HelpHandler *)operator_new(0x18);
  Application::Application((Application *)h,3);
  h_00 = (Widget *)operator_new(0x20);
  Dialog::Dialog((Dialog *)h_00,h,1);
  this = (Button *)operator_new(0x20);
  Button::Button(this,h_00,2);
  (*(this->super_Widget).super_HelpHandler._vptr_HelpHandler[2])();
  return 0;
}

Assistant:

int main()
{
    const Topic PRINT_TOPIC = 1;
    const Topic PAPER_ORIENTATION_TOPIC = 2;
    const Topic APPLICATION_TOPIC = 3;

    Application* application = new Application(APPLICATION_TOPIC);
    Dialog* dialog = new Dialog(application, PRINT_TOPIC);
    Button* button = new Button(dialog, PAPER_ORIENTATION_TOPIC);

    button->HandleHelp();
}